

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O1

QString * QLockFilePrivate::processNameByPid(QString *__return_storage_ptr__,qint64 pid)

{
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView needle;
  QByteArrayView haystack;
  char exePath [64];
  QByteArray local_b8;
  QFileSystemEntry local_a0;
  char local_68 [72];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (qt_haveLinuxProcfs()::present == '\0') {
    processNameByPid();
  }
  if (qt_haveLinuxProcfs()::present == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003cab0f;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_68[0x30] = -0x56;
    local_68[0x31] = -0x56;
    local_68[0x32] = -0x56;
    local_68[0x33] = -0x56;
    local_68[0x34] = -0x56;
    local_68[0x35] = -0x56;
    local_68[0x36] = -0x56;
    local_68[0x37] = -0x56;
    local_68[0x38] = -0x56;
    local_68[0x39] = -0x56;
    local_68[0x3a] = -0x56;
    local_68[0x3b] = -0x56;
    local_68[0x3c] = -0x56;
    local_68[0x3d] = -0x56;
    local_68[0x3e] = -0x56;
    local_68[0x3f] = -0x56;
    local_68[0x20] = -0x56;
    local_68[0x21] = -0x56;
    local_68[0x22] = -0x56;
    local_68[0x23] = -0x56;
    local_68[0x24] = -0x56;
    local_68[0x25] = -0x56;
    local_68[0x26] = -0x56;
    local_68[0x27] = -0x56;
    local_68[0x28] = -0x56;
    local_68[0x29] = -0x56;
    local_68[0x2a] = -0x56;
    local_68[0x2b] = -0x56;
    local_68[0x2c] = -0x56;
    local_68[0x2d] = -0x56;
    local_68[0x2e] = -0x56;
    local_68[0x2f] = -0x56;
    local_68[0x10] = -0x56;
    local_68[0x11] = -0x56;
    local_68[0x12] = -0x56;
    local_68[0x13] = -0x56;
    local_68[0x14] = -0x56;
    local_68[0x15] = -0x56;
    local_68[0x16] = -0x56;
    local_68[0x17] = -0x56;
    local_68[0x18] = -0x56;
    local_68[0x19] = -0x56;
    local_68[0x1a] = -0x56;
    local_68[0x1b] = -0x56;
    local_68[0x1c] = -0x56;
    local_68[0x1d] = -0x56;
    local_68[0x1e] = -0x56;
    local_68[0x1f] = -0x56;
    local_68[0] = -0x56;
    local_68[1] = -0x56;
    local_68[2] = -0x56;
    local_68[3] = -0x56;
    local_68[4] = -0x56;
    local_68[5] = -0x56;
    local_68[6] = -0x56;
    local_68[7] = -0x56;
    local_68[8] = -0x56;
    local_68[9] = -0x56;
    local_68[10] = -0x56;
    local_68[0xb] = -0x56;
    local_68[0xc] = -0x56;
    local_68[0xd] = -0x56;
    local_68[0xe] = -0x56;
    local_68[0xf] = -0x56;
    sprintf(local_68,"/proc/%lld/exe",pid);
    local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    qt_readlink(&local_b8,local_68);
    if ((undefined1 *)local_b8.d.size == (undefined1 *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = L"/ERROR/";
      (__return_storage_ptr__->d).size = 7;
    }
    else {
      needle.m_data = " (deleted)";
      needle.m_size = 10;
      haystack.m_data = local_b8.d.ptr;
      haystack.m_size = local_b8.d.size;
      bVar1 = QtPrivate::endsWith(haystack,needle);
      if (bVar1) {
        QByteArray::chop(&local_b8,10);
      }
      QFileSystemEntry::QFileSystemEntry(&local_a0,&local_b8);
      QFileSystemEntry::fileName(__return_storage_ptr__,&local_a0);
      if (&(local_a0.m_nativeFilePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i = ((local_a0.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a0.m_nativeFilePath.d.d)->super_QArrayData).ref_._q_value.
            super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a0.m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (&(local_a0.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
             _M_i + -1;
        UNLOCK();
        if (((local_a0.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
            _M_i == 0) {
          QArrayData::deallocate(&(local_a0.m_filePath.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_003cab0f:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLockFilePrivate::processNameByPid(qint64 pid)
{
#if defined(Q_OS_MACOS)
    char name[1024];
    proc_name(pid, name, sizeof(name) / sizeof(char));
    return QFile::decodeName(name);
#elif defined(Q_OS_LINUX)
    if (!qt_haveLinuxProcfs())
        return QString();

    char exePath[64];
    sprintf(exePath, "/proc/%lld/exe", pid);

    QByteArray buf = qt_readlink(exePath);
    if (buf.isEmpty()) {
        // The pid is gone. Return some invalid process name to fail the test.
        return QStringLiteral("/ERROR/");
    }

    // remove the " (deleted)" suffix, if any
    static const char deleted[] = " (deleted)";
    if (buf.endsWith(deleted))
        buf.chop(strlen(deleted));

    return QFileSystemEntry(buf, QFileSystemEntry::FromNativePath()).fileName();
#elif defined(Q_OS_HAIKU)
    thread_info info;
    if (get_thread_info(pid, &info) != B_OK)
        return QString();
    return QFile::decodeName(info.name);
#elif defined(Q_OS_BSD4) && !defined(QT_PLATFORM_UIKIT)
# if defined(Q_OS_NETBSD)
    struct kinfo_proc2 kp;
    int mib[6] = { CTL_KERN, KERN_PROC2, KERN_PROC_PID, (int)pid, sizeof(struct kinfo_proc2), 1 };
# elif defined(Q_OS_OPENBSD)
    struct kinfo_proc kp;
    int mib[6] = { CTL_KERN, KERN_PROC, KERN_PROC_PID, (int)pid, sizeof(struct kinfo_proc), 1 };
# else
    struct kinfo_proc kp;
    int mib[4] = { CTL_KERN, KERN_PROC, KERN_PROC_PID, (int)pid };
# endif
    size_t len = sizeof(kp);
    u_int mib_len = sizeof(mib)/sizeof(u_int);

    if (sysctl(mib, mib_len, &kp, &len, NULL, 0) < 0)
        return QString();

# if defined(Q_OS_OPENBSD) || defined(Q_OS_NETBSD)
    if (kp.p_pid != pid)
        return QString();
    QString name = QFile::decodeName(kp.p_comm);
# else
    if (kp.ki_pid != pid)
        return QString();
    QString name = QFile::decodeName(kp.ki_comm);
# endif
    return name;
#elif defined(Q_OS_QNX)
    char exePath[PATH_MAX];
    sprintf(exePath, "/proc/%lld/exefile", pid);

    int fd = qt_safe_open(exePath, O_RDONLY);
    if (fd == -1)
        return QString();

    QT_STATBUF sbuf;
    if (QT_FSTAT(fd, &sbuf) == -1) {
        qt_safe_close(fd);
        return QString();
    }

    QByteArray buffer(sbuf.st_size, Qt::Uninitialized);
    buffer.resize(qt_safe_read(fd, buffer.data(), sbuf.st_size - 1));
    if (buffer.isEmpty()) {
        // The pid is gone. Return some invalid process name to fail the test.
        return QStringLiteral("/ERROR/");
    }
    return QFileSystemEntry(buffer, QFileSystemEntry::FromNativePath()).fileName();
#else
    Q_UNUSED(pid);
    return QString();
#endif
}